

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# publication.cpp
# Opt level: O2

void __thiscall miniros::Publication::getInfo(Publication *this,XmlRpcValue *info)

{
  int i;
  XmlRpcValue *pXVar1;
  pointer psVar2;
  XmlRpcValue curr_info;
  string local_60;
  XmlRpcValue local_40;
  
  std::mutex::lock(&this->subscriber_links_mutex_);
  for (psVar2 = (this->subscriber_links_).
                super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      psVar2 != (this->subscriber_links_).
                super__Vector_base<std::shared_ptr<miniros::SubscriberLink>,_std::allocator<std::shared_ptr<miniros::SubscriberLink>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; psVar2 = psVar2 + 1) {
    curr_info._type = TypeInvalid;
    curr_info._value.asDouble = 0.0;
    local_60._M_dataplus._M_p._0_4_ =
         ((psVar2->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
         ->connection_id_;
    pXVar1 = XmlRpc::XmlRpcValue::operator[](&curr_info,0);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(int *)&local_60);
    XmlRpc::XmlRpcValue::XmlRpcValue
              ((XmlRpcValue *)&local_60,
               &((psVar2->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>).
                _M_ptr)->destination_caller_id_);
    pXVar1 = XmlRpc::XmlRpcValue::operator[](&curr_info,1);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(XmlRpcValue *)&local_60);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)&local_60);
    pXVar1 = XmlRpc::XmlRpcValue::operator[](&curr_info,2);
    XmlRpc::XmlRpcValue::operator=(pXVar1,"o");
    (*((psVar2->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_SubscriberLink[4])(&local_60);
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,&local_60);
    pXVar1 = XmlRpc::XmlRpcValue::operator[](&curr_info,3);
    XmlRpc::XmlRpcValue::operator=(pXVar1,&local_40);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    XmlRpc::XmlRpcValue::XmlRpcValue((XmlRpcValue *)&local_60,&this->name_);
    pXVar1 = XmlRpc::XmlRpcValue::operator[](&curr_info,4);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(XmlRpcValue *)&local_60);
    XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)&local_60);
    local_60._M_dataplus._M_p._0_4_ = CONCAT31(local_60._M_dataplus._M_p._1_3_,1);
    pXVar1 = XmlRpc::XmlRpcValue::operator[](&curr_info,5);
    XmlRpc::XmlRpcValue::operator=(pXVar1,(bool *)&local_60);
    (*((psVar2->super___shared_ptr<miniros::SubscriberLink,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
      _vptr_SubscriberLink[5])(&local_60);
    XmlRpc::XmlRpcValue::XmlRpcValue(&local_40,&local_60);
    pXVar1 = XmlRpc::XmlRpcValue::operator[](&curr_info,6);
    XmlRpc::XmlRpcValue::operator=(pXVar1,&local_40);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    i = XmlRpc::XmlRpcValue::size(info);
    pXVar1 = XmlRpc::XmlRpcValue::operator[](info,i);
    XmlRpc::XmlRpcValue::operator=(pXVar1,&curr_info);
    XmlRpc::XmlRpcValue::~XmlRpcValue(&curr_info);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->subscriber_links_mutex_);
  return;
}

Assistant:

void Publication::getInfo(XmlRpc::XmlRpcValue& info)
{
  std::scoped_lock<std::mutex> lock(subscriber_links_mutex_);

  for (V_SubscriberLink::iterator c = subscriber_links_.begin();
       c != subscriber_links_.end(); ++c)
  {
    XmlRpc::XmlRpcValue curr_info;
    curr_info[0] = (int)(*c)->getConnectionID();
    curr_info[1] = (*c)->getDestinationCallerID();
    curr_info[2] = "o";
    curr_info[3] = (*c)->getTransportType();
    curr_info[4] = name_;
    curr_info[5] = true; // For length compatibility with rospy
    curr_info[6] = (*c)->getTransportInfo();
    info[info.size()] = curr_info;
  }
}